

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_armor_upgrades.hpp
# Opt level: O0

uint32_t PatchArmorUpgrades::inject_function_change_item_in_reward_textbox
                   (ROM *rom,uint32_t function_alter_item_in_d0)

{
  uint32_t uVar1;
  allocator<char> local_e1;
  string local_e0;
  Param local_c0 [2];
  DataRegister local_b0 [2];
  undefined1 local_90 [8];
  Code func;
  uint32_t function_alter_item_in_d0_local;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = function_alter_item_in_d0;
  md::Code::Code((Code *)local_90);
  md::Code::jsr((Code *)local_90,func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               );
  md::DataRegister::DataRegister(local_b0,'\0');
  addr_<void>((uint32_t)local_c0,0xff1196);
  md::Code::movew((Code *)local_90,(Param *)local_b0,local_c0);
  md::Code::rts((Code *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

[[nodiscard]] static uint32_t inject_function_change_item_in_reward_textbox(md::ROM& rom, uint32_t function_alter_item_in_d0)
    {
        md::Code func;
        {
            func.jsr(function_alter_item_in_d0);
            func.movew(reg_D0, addr_(0xFF1196));
            func.rts();
        }
        return rom.inject_code(func);
    }